

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFunctionalTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FunctionalTests::init(FunctionalTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestCaseGroup *pTVar2;
  FunctionalTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  PrerequisiteTests::PrerequisiteTests
            ((PrerequisiteTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ImplementationLimitTests::ImplementationLimitTests
            ((ImplementationLimitTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ColorClearTest::ColorClearTest((ColorClearTest *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  DepthStencilClearTests::DepthStencilClearTests
            ((DepthStencilClearTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  BufferTests::BufferTests((BufferTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderTests::ShaderTests((ShaderTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureTests::TextureTests((TextureTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FragmentOpTests::FragmentOpTests((FragmentOpTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboTests::FboTests((FboTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrayTestGroup::VertexArrayTestGroup
            ((VertexArrayTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  UniformBlockTests::UniformBlockTests
            ((UniformBlockTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  UniformApiTests::UniformApiTests((UniformApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = createAttributeLocationTests((this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar1 = (TestNode *)operator_new(0x78);
  FragmentOutputTests::FragmentOutputTests
            ((FragmentOutputTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SamplerObjectTests::SamplerObjectTests
            ((SamplerObjectTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  PixelBufferObjectTests::PixelBufferObjectTests
            ((PixelBufferObjectTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RasterizationTests::RasterizationTests
            ((RasterizationTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  OcclusionQueryTests::OcclusionQueryTests
            ((OcclusionQueryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  VertexArrayObjectTestGroup::VertexArrayObjectTestGroup
            ((VertexArrayObjectTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  PrimitiveRestartTests::PrimitiveRestartTests
            ((PrimitiveRestartTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  InstancedRenderingTests::InstancedRenderingTests
            ((InstancedRenderingTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RasterizerDiscardTests::RasterizerDiscardTests
            ((RasterizerDiscardTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TransformFeedbackTests::TransformFeedbackTests
            ((TransformFeedbackTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SyncTests::SyncTests((SyncTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderApiTests::ShaderApiTests((ShaderApiTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  NegativeApiTestGroup::NegativeApiTestGroup
            ((NegativeApiTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTests::MultisampleTests
            ((MultisampleTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ReadPixelsTests::ReadPixelsTests((ReadPixelsTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  DitheringTests::DitheringTests((DitheringTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  StateQueryTests::StateQueryTests((StateQueryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ClippingTests::ClippingTests((ClippingTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  PolygonOffsetTests::PolygonOffsetTests
            ((PolygonOffsetTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  DrawTests::DrawTests((DrawTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  FlushFinishTests::FlushFinishTests
            ((FlushFinishTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  DefaultVertexAttributeTests::DefaultVertexAttributeTests
            ((DefaultVertexAttributeTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = createLifetimeTests((this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pTVar1 = (TestNode *)operator_new(0x78);
  DefaultVertexArrayObjectTests::DefaultVertexArrayObjectTests
            ((DefaultVertexArrayObjectTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void FunctionalTests::init (void)
{
	addChild(new PrerequisiteTests				(m_context));
	addChild(new ImplementationLimitTests		(m_context));
	addChild(new ColorClearTest					(m_context));
	addChild(new DepthStencilClearTests			(m_context));
	addChild(new BufferTests					(m_context));
	addChild(new ShaderTests					(m_context));
	addChild(new TextureTests					(m_context));
	addChild(new FragmentOpTests				(m_context));
	addChild(new FboTests						(m_context));
	addChild(new VertexArrayTestGroup			(m_context));
	addChild(new UniformBlockTests				(m_context));
	addChild(new UniformApiTests				(m_context));
	addChild(createAttributeLocationTests		(m_context));
	addChild(new FragmentOutputTests			(m_context));
	addChild(new SamplerObjectTests				(m_context));
	addChild(new PixelBufferObjectTests			(m_context));
	addChild(new RasterizationTests				(m_context));
	addChild(new OcclusionQueryTests			(m_context));
	addChild(new VertexArrayObjectTestGroup		(m_context));
	addChild(new PrimitiveRestartTests			(m_context));
	addChild(new InstancedRenderingTests		(m_context));
	addChild(new RasterizerDiscardTests			(m_context));
	addChild(new TransformFeedbackTests			(m_context));
	addChild(new SyncTests						(m_context));
	addChild(new ShaderApiTests					(m_context));
	addChild(new NegativeApiTestGroup			(m_context));
	addChild(new MultisampleTests				(m_context));
	addChild(new ReadPixelsTests				(m_context));
	addChild(new DitheringTests					(m_context));
	addChild(new StateQueryTests				(m_context));
	addChild(new ClippingTests					(m_context));
	addChild(new PolygonOffsetTests				(m_context));
	addChild(new DrawTests						(m_context));
	addChild(new FlushFinishTests				(m_context));
	addChild(new DefaultVertexAttributeTests	(m_context));
	addChild(createLifetimeTests				(m_context));
	addChild(new DefaultVertexArrayObjectTests	(m_context));
}